

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceTask_DemoLDF::run(search *sch,multi_ex *ec)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  uint32_t uVar4;
  predictor *ppVar5;
  stringstream *psVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  uint hi;
  int iVar10;
  ptag tag;
  ulong uVar11;
  predictor P;
  
  plVar1 = (long *)sch->task_data;
  Search::predictor::predictor(&P,sch,0);
  hi = 0;
  while (uVar11 = (ulong)hi,
        uVar11 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
    for (iVar10 = 1; uVar9 = (ulong)(iVar10 - 1), uVar9 < (ulong)plVar1[1]; iVar10 = iVar10 + 1) {
      bVar3 = Search::search::predictNeedsExample(sch);
      if (bVar3) {
        VW::copy_example_data
                  (false,(example *)(*plVar1 + uVar9 * 0x68d0),
                   (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar11]);
        my_update_example_indicies
                  (sch,false,(example *)(uVar9 * 0x68d0 + *plVar1),0x1b90d09,uVar9 * 0x49be95);
      }
      lVar2 = *plVar1;
      lVar8 = uVar9 * 0x68d0;
      **(undefined4 **)(lVar2 + 0x6828 + lVar8) = 0;
      *(int *)(*(long *)(lVar2 + 0x6828 + lVar8) + 4) = iVar10;
      *(undefined4 *)(*(long *)(lVar2 + 0x6828 + lVar8) + 8) = 0;
      *(undefined4 *)(*(long *)(lVar2 + 0x6828 + lVar8) + 0xc) = 0;
    }
    uVar4 = ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar11]->l).multi.label;
    tag = hi + 1;
    ppVar5 = Search::predictor::set_tag(&P,tag);
    ppVar5 = Search::predictor::set_input(ppVar5,(example *)*plVar1,plVar1[1]);
    ppVar5 = Search::predictor::set_oracle(ppVar5,uVar4 - 1);
    uVar4 = Search::search::get_history_length(sch);
    ppVar5 = Search::predictor::set_condition_range(ppVar5,hi,uVar4,'p');
    Search::predictor::predict(ppVar5);
    psVar6 = Search::search::output_abi_cxx11_(sch);
    hi = tag;
    if (*(int *)(psVar6 + *(long *)(*(long *)psVar6 + -0x18) + 0x20) == 0) {
      psVar6 = Search::search::output_abi_cxx11_(sch);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar6 + 0x10));
      std::operator<<(poVar7,' ');
    }
  }
  Search::predictor::~predictor(&P);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* data = sch.get_task_data<task_data>();
  Search::predictor P(sch, (ptag)0);
  for (ptag i = 0; i < ec.size(); i++)
  {
    for (uint32_t a = 0; a < data->num_actions; a++)
    {
      if (sch.predictNeedsExample())  // we can skip this work if `predict` won't actually use the example data
      {
        VW::copy_example_data(false, &data->ldf_examples[a], ec[i]);  // copy but leave label alone!
        // now, offset it appropriately for the action id
        my_update_example_indicies(sch, true, &data->ldf_examples[a], 28904713, 4832917 * (uint64_t)a);
      }

      // regardless of whether the example is needed or not, the class info is needed
      CS::label& lab = data->ldf_examples[a].l.cs;
      // need to tell search what the action id is, so that it can add history features correctly!
      lab.costs[0].x = 0.;
      lab.costs[0].class_index = a + 1;
      lab.costs[0].partial_prediction = 0.;
      lab.costs[0].wap_value = 0.;
    }

    action oracle = ec[i]->l.multi.label - 1;
    action pred_id = P.set_tag((ptag)(i + 1))
                         .set_input(data->ldf_examples, data->num_actions)
                         .set_oracle(oracle)
                         .set_condition_range(i, sch.get_history_length(), 'p')
                         .predict();
    action prediction = pred_id + 1;  // or ldf_examples[pred_id]->ld.costs[0].weight_index

    if (sch.output().good())
      sch.output() << prediction << ' ';
  }
}